

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

int QTest::qToInt(char *str)

{
  long lVar1;
  long in_FS_OFFSET;
  char *pEnd;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  lVar1 = strtol(str,&local_20,10);
  if (*local_20 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return (int)lVar1;
    }
  }
  else {
    qToInt();
  }
  __stack_chk_fail();
}

Assistant:

static int qToInt(const char *str)
{
    char *pEnd;
    int l = static_cast<int>(strtol(str, &pEnd, 10));
    if (*pEnd != 0) {
        std::fprintf(stderr, "Invalid numeric parameter: '%s'\n", str);
        exit(1);
    }
    return l;
}